

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.h
# Opt level: O0

JtagShiftedData * __thiscall
JtagShiftedData::GetTDOLengthString_abi_cxx11_(JtagShiftedData *this,bool with_parentheses)

{
  byte in_DL;
  undefined7 in_register_00000031;
  allocator local_aa;
  undefined1 local_a9;
  char local_a8 [8];
  S8 bit_count_buffer [128];
  U64 bit_count;
  bool with_parentheses_local;
  JtagShiftedData *this_local;
  string *bit_count_string;
  
  bit_count_buffer._120_8_ =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  (CONCAT71(in_register_00000031,with_parentheses) + 0x20));
  if ((in_DL & 1) == 0) {
    sprintf(local_a8,"%llu",bit_count_buffer._120_8_);
  }
  else {
    sprintf(local_a8,"(%llu)",bit_count_buffer._120_8_);
  }
  local_a9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_a8,&local_aa);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  return this;
}

Assistant:

std::string GetTDOLengthString( bool with_parentheses = true ) const
    {
        U64 bit_count = mTdoBits.size();
        S8 bit_count_buffer[ 128 ];
        if( with_parentheses )
            sprintf( bit_count_buffer, "(%llu)", bit_count );
        else
            sprintf( bit_count_buffer, "%llu", bit_count );
        std::string bit_count_string = bit_count_buffer;
        return bit_count_string;
    }